

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

int binbuf_write(_binbuf *x,char *filename,char *dir,int crflag)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  FILE *__s;
  long lVar4;
  t_atomtype tVar5;
  t_atom *a;
  char *buf;
  char fbuf [1000];
  char sbuf [4096];
  _binbuf *local_1430;
  char local_1428 [999];
  undefined1 local_1041;
  char local_1038 [4096];
  undefined1 local_38 [8];
  
  if (*dir == '\0') {
    snprintf(local_1428,999,"%s",filename);
  }
  else {
    snprintf(local_1428,999,"%s/%s",dir,filename);
  }
  local_1041 = 0;
  sVar3 = strlen(filename);
  iVar2 = strcmp(filename + (sVar3 - 4),".pat");
  if ((iVar2 == 0) || (iVar2 = strcmp(filename + (sVar3 - 4),".mxt"), iVar2 == 0)) {
    x = binbuf_convert(x,0);
    local_1430 = x;
  }
  else {
    local_1430 = (_binbuf *)0x0;
  }
  __s = (FILE *)sys_fopen(local_1428,"w");
  if (__s != (FILE *)0x0) {
    iVar2 = x->b_n;
    if (iVar2 == 0) {
      buf = local_1038;
    }
    else {
      a = x->b_vec;
      buf = local_1038;
      do {
        tVar5 = a->a_type;
        if ((tVar5 == A_DOLLSYM) || (lVar4 = 0x28, tVar5 == A_SYMBOL)) {
          sVar3 = strlen(((a->a_w).w_symbol)->s_name);
          lVar4 = (long)((int)sVar3 + 0x50);
        }
        if ((long)local_38 - (long)buf < lVar4) {
          sVar3 = fwrite(local_1038,(long)buf - (long)local_1038,1,__s);
          if (sVar3 == 0) goto LAB_0016939e;
          tVar5 = a->a_type;
          buf = local_1038;
        }
        if (tVar5 == A_SEMI) {
          if ((local_1038 < buf) && (buf[-1] == ' ')) {
            buf = buf + -1;
          }
          cVar1 = '\n';
          if (crflag == 0) goto LAB_00169311;
        }
        else {
          if (((tVar5 == A_COMMA) && (local_1038 < buf)) && (buf[-1] == ' ')) {
            buf = buf + -1;
          }
LAB_00169311:
          atom_string(a,buf,((int)local_38 - (int)buf) - 2);
          sVar3 = strlen(buf);
          buf = buf + (int)sVar3;
          cVar1 = ' ';
          if (a->a_type == A_SEMI) {
            cVar1 = '\n';
          }
        }
        iVar2 = iVar2 + -1;
        *buf = cVar1;
        buf = buf + 1;
        a = a + 1;
      } while (iVar2 != 0);
    }
    sVar3 = fwrite(local_1038,(long)buf - (long)local_1038,1,__s);
    if ((sVar3 != 0) && (iVar2 = fflush(__s), iVar2 == 0)) {
      iVar2 = 0;
      if (local_1430 != (_binbuf *)0x0) {
        freebytes(local_1430->b_vec,(long)local_1430->b_n << 4);
        freebytes(local_1430,0x10);
      }
      goto LAB_001693d4;
    }
  }
LAB_0016939e:
  if (local_1430 != (_binbuf *)0x0) {
    freebytes(local_1430->b_vec,(long)local_1430->b_n << 4);
    freebytes(local_1430,0x10);
  }
  iVar2 = 1;
  if (__s == (FILE *)0x0) {
    return 1;
  }
LAB_001693d4:
  fclose(__s);
  return iVar2;
}

Assistant:

int binbuf_write(const t_binbuf *x, const char *filename, const char *dir, int crflag)
{
    FILE *f = 0;
    char sbuf[WBUFSIZE], fbuf[MAXPDSTRING], *bp = sbuf, *ep = sbuf + WBUFSIZE;
    t_atom *ap;
    t_binbuf *y = 0;
    const t_binbuf *z = x;
    int indx;

    if (*dir)
        snprintf(fbuf, MAXPDSTRING-1, "%s/%s", dir, filename);
    else
        snprintf(fbuf, MAXPDSTRING-1, "%s", filename);
    fbuf[MAXPDSTRING-1] = 0;

    if (!strcmp(filename + strlen(filename) - 4, ".pat") ||
        !strcmp(filename + strlen(filename) - 4, ".mxt"))
    {
        y = binbuf_convert(x, 0);
        z = y;
    }

    if (!(f = sys_fopen(fbuf, "w")))
        goto fail;
    for (ap = z->b_vec, indx = z->b_n; indx--; ap++)
    {
        int length;
            /* estimate how many characters will be needed.  Printing out
            symbols may need extra characters for inserting backslashes. */
        if (ap->a_type == A_SYMBOL || ap->a_type == A_DOLLSYM)
            length = 80 + (int)strlen(ap->a_w.w_symbol->s_name);
        else length = 40;
        if (ep - bp < length)
        {
            if (fwrite(sbuf, bp-sbuf, 1, f) < 1)
                goto fail;
            bp = sbuf;
        }
        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
            bp > sbuf && bp[-1] == ' ') bp--;
        if (!crflag || ap->a_type != A_SEMI)
        {
            atom_string(ap, bp, (unsigned int)((ep-bp)-2));
            length = (int)strlen(bp);
            bp += length;
        }
        if (ap->a_type == A_SEMI)
        {
            *bp++ = '\n';
        }
        else
        {
            *bp++ = ' ';
        }
    }
    if (fwrite(sbuf, bp-sbuf, 1, f) < 1)
        goto fail;

    if (fflush(f) != 0)
        goto fail;

    if (y)
        binbuf_free(y);
    fclose(f);
    return (0);
fail:
    if (y)
        binbuf_free(y);
    if (f)
        fclose(f);
    return (1);
}